

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O0

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CArgument *stm)

{
  bool bVar1;
  element_type *peVar2;
  pointer pCVar3;
  pointer pCVar4;
  VariableInfo *this_00;
  element_type *peVar5;
  shared_ptr<TypeInfo> local_48;
  shared_ptr<VariableInfo> local_38;
  shared_ptr<TypeInfo> local_28;
  CArgument *local_18;
  CArgument *stm_local;
  CConstructSymbolTableVisitor *this_local;
  
  local_18 = stm;
  stm_local = (CArgument *)this;
  std::shared_ptr<TypeInfo>::shared_ptr(&local_28,(nullptr_t)0x0);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<TypeInfo>::operator=(&peVar2->iType,&local_28);
  std::shared_ptr<TypeInfo>::~shared_ptr(&local_28);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->type);
  if (bVar1) {
    pCVar3 = std::unique_ptr<CType,_std::default_delete<CType>_>::operator->(&local_18->type);
    (**(pCVar3->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar3,this);
  }
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::__cxx11::string::operator=((string *)&peVar2->iName,"");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->id);
  if (bVar1) {
    pCVar4 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&local_18->id);
    (**(pCVar4->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar4,this);
  }
  this_00 = (VariableInfo *)operator_new(0x38);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  peVar5 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<TypeInfo>::shared_ptr(&local_48,&peVar5->iType);
  VariableInfo::VariableInfo(this_00,&peVar2->iName,&local_48);
  std::shared_ptr<VariableInfo>::shared_ptr<VariableInfo,void>(&local_38,this_00);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<VariableInfo>::operator=(&peVar2->iVariable,&local_38);
  std::shared_ptr<VariableInfo>::~shared_ptr(&local_38);
  std::shared_ptr<TypeInfo>::~shared_ptr(&local_48);
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CArgument &stm )
{
//	std::cout << "arg\n";
	info->iType = nullptr;
	if( stm.type ) {
		stm.type->Accept( *this );
	}
	info->iName = "";
	if( stm.id ) {
		stm.id->Accept( *this );
	}
	info->iVariable = std::shared_ptr<VariableInfo>( new VariableInfo( info->iName, info->iType ) );
}